

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::execute_silver_linings(string *mesh_in,string *geo_out)

{
  int iVar1;
  clock_t cVar2;
  clock_t cVar3;
  ostream *poVar4;
  string *this;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  cVar2 = clock();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"See logfile.txt for conversion information",&local_101);
  print_ln(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "=================================== START ==================================",
             &local_101);
  print_ln(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "-------------------------------- CONVERTING... -----------------------------",
             &local_101);
  print_ln(&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,(string *)mesh_in);
  std::__cxx11::string::string((string *)&local_c0,(string *)geo_out);
  iVar1 = begin_processing(&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (iVar1 == 0) {
    cVar3 = clock();
    poVar4 = std::operator<<((ostream *)&std::cout,"Program execution took ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)(cVar3 - cVar2) / 1e+06);
    poVar4 = std::operator<<(poVar4," seconds");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,
               "============================== CONVERSION END ==============================",
               &local_101);
    print_ln(&local_100);
    this = &local_100;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Error: Conversion failed. See logfile.txt for why.",&local_101);
    print_ln(&local_e0);
    this = &local_e0;
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void UI::execute_silver_linings(std::string mesh_in, std::string geo_out)
{
    clock_t execution_time;
    execution_time = clock();
    print_ln("See logfile.txt for conversion information");
    print_ln("=================================== START ==================================");
    print_ln("-------------------------------- CONVERTING... -----------------------------");
    int outcome = begin_processing(mesh_in, geo_out);
    if (outcome!=0)
    {
        print_ln("Error: Conversion failed. See logfile.txt for why.");
    }
    else
    {
        execution_time = clock() - execution_time;
        std::cout << "Program execution took "
        << (float)execution_time / CLOCKS_PER_SEC
        << " seconds" << std::endl;
        print_ln("============================== CONVERSION END ==============================");
    }
}